

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O1

void __thiscall Net::UnZip(Net *this,string *FileName)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pointer pvVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  undefined1 uVar5;
  long *plVar6;
  pointer pvVar7;
  long lVar8;
  size_t i;
  long lVar9;
  uint8_t buf [4];
  ifstream in;
  allocator_type local_2a9;
  undefined1 local_2a8 [24];
  long lStack_290;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  size_type local_258;
  Net *local_250;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_248;
  long local_240;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)FileName,_S_bin);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    lVar9 = 0;
    do {
      uVar5 = std::istream::get();
      local_2a8[lVar9] = uVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    this->function_type = local_2a8._0_4_;
    lVar9 = 0;
    do {
      uVar5 = std::istream::get();
      local_2a8[lVar9] = uVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_258 = (size_type)(int)local_2a8._0_4_;
    net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
    ::deserialize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_278,local_238);
    local_2a8._0_8_ =
         (this->biases).
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2a8._8_8_ =
         (this->biases).
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2a8._16_8_ =
         (this->biases).
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->biases).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278._M_dataplus._M_p;
    (this->biases).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_278._M_string_length;
    (this->biases).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_278.field_2._M_allocated_capacity;
    local_278._M_dataplus._M_p = (pointer)0x0;
    local_278._M_string_length = 0;
    local_278.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_2a8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_278);
    net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
    ::deserialize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *)&local_278,local_238);
    local_2a8._0_8_ =
         (this->weights).
         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2a8._8_8_ =
         (this->weights).
         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2a8._16_8_ =
         (this->weights).
         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->weights).
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278._M_dataplus._M_p;
    (this->weights).
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_278._M_string_length;
    (this->weights).
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_278.field_2._M_allocated_capacity;
    local_278._M_dataplus._M_p = (pointer)0x0;
    local_278._M_string_length = 0;
    local_278.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)local_2a8);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)&local_278);
    local_248 = &this->init;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_248,
             ((long)(this->weights).
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->weights).
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_280 = &this->mesh;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_280,
             ((long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->init_biases,
             ((long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->biases).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if (0 < (int)((ulong)((long)(this->biases).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->biases).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      lVar8 = 0;
      lVar9 = 0;
      local_250 = this;
      do {
        this_00 = (local_248->
                  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (lVar8 == 0) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(this_00,0);
          local_2a8._0_8_ = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((local_280->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,local_258,
                     (value_type_conflict2 *)local_2a8);
          local_2a8._0_8_ = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((this->init_biases).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     ((long)(this->biases).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->biases).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                     (value_type_conflict2 *)local_2a8);
        }
        else {
          pvVar1 = (this->weights).
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar8);
          lVar3 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar8 + 8);
          plVar6 = *(long **)((long)&(pvVar1->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data + lVar8);
          local_278._M_dataplus._M_p = (pointer)0x0;
          local_240 = lVar9;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_2a8,plVar6[1] - *plVar6 >> 3,
                     (value_type_conflict2 *)&local_278,&local_2a9);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::_M_fill_assign((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)((long)&(this_00->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar8),
                           (lVar3 - lVar2 >> 3) * -0x5555555555555555,
                           (vector<double,_std::allocator<double>_> *)local_2a8);
          lVar9 = local_240;
          this = local_250;
          if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
          }
          pvVar7 = (this->biases).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_2a8._0_8_ = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&(((this->mesh).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar8),
                     *(long *)((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar8 + 8) -
                     *(long *)((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar8) >> 3,
                     (value_type_conflict2 *)local_2a8);
          local_2a8._0_8_ = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&(((this->init_biases).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar8),
                     ((long)(this->biases).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->biases).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                     (value_type_conflict2 *)local_2a8);
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar9 < (int)((ulong)((long)(this->biases).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->biases).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(&this->meshZ,local_280);
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::operator+(&local_278,"File ",FileName);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2a8._0_8_ = *plVar6;
  pvVar7 = (pointer)(plVar6 + 2);
  if ((pointer)local_2a8._0_8_ == pvVar7) {
    local_2a8._16_8_ =
         (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start;
    lStack_290 = plVar6[3];
    local_2a8._0_8_ = (pointer)(local_2a8 + 0x10);
  }
  else {
    local_2a8._16_8_ =
         (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_2a8._8_8_ = plVar6[1];
  *plVar6 = (long)pvVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::operator<<((ostream *)&std::cerr,(string *)local_2a8);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string((string *)&local_278);
  exit(1);
}

Assistant:

void Net::UnZip(const std::string& FileName){
    std::ifstream in(FileName, std::ios::binary);
    if (!in.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    function_type = (FUNCTIONS)net_serializer<int>::deserialize(in);
    int input = net_serializer<int>::deserialize(in);
    biases = net_serializer<decltype(biases)>::deserialize(in);
    weights = net_serializer<decltype(weights)>::deserialize(in);

    init.resize(weights.size());
    mesh.resize(biases.size());
    init_biases.resize(biases.size());
    for (int i = 0; i < (int)biases.size(); ++i){
        if (i == 0) {
            init[i].resize(0);
            mesh[i].assign(input, 0);
            init_biases[i].assign(biases.size(), 0);
        }else {
            init[i].assign(weights[i].size(), Layer(weights[i][0].size(), 0));
            mesh[i].assign(biases[i].size(), 0);
            init_biases[i].assign(biases.size(), 0);
        }
    }
    meshZ = mesh;
}